

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_log_module.c
# Opt level: O1

size_t ngx_http_log_variable_getlen(ngx_http_request_t *r,uintptr_t data)

{
  uint uVar1;
  ngx_http_variable_value_t *pnVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  
  pnVar2 = ngx_http_get_indexed_variable(r,data);
  sVar3 = 1;
  if (pnVar2 != (ngx_http_variable_value_t *)0x0) {
    uVar1 = *(uint *)pnVar2;
    if ((uVar1 >> 0x1e & 1) == 0) {
      if ((uVar1 & 0xfffffff) == 0) {
        lVar4 = 0;
      }
      else {
        uVar5 = 0;
        lVar4 = 0;
        do {
          lVar4 = lVar4 + (ulong)((ngx_http_log_escape::escape[pnVar2->data[uVar5] >> 5] >>
                                   (pnVar2->data[uVar5] & 0x1f) & 1) != 0);
          uVar5 = uVar5 + 1;
        } while (((ulong)uVar1 & 0xfffffff) != uVar5);
      }
      *(uint *)pnVar2 = uVar1 & 0x3fffffff | (uint)(lVar4 != 0) << 0x1f;
      sVar3 = lVar4 * 3 + ((ulong)uVar1 & 0xfffffff);
    }
  }
  return sVar3;
}

Assistant:

static size_t
ngx_http_log_variable_getlen(ngx_http_request_t *r, uintptr_t data)
{
    uintptr_t                   len;
    ngx_http_variable_value_t  *value;

    value = ngx_http_get_indexed_variable(r, data);

    if (value == NULL || value->not_found) {
        return 1;
    }

    len = ngx_http_log_escape(NULL, value->data, value->len);

    value->escape = len ? 1 : 0;

    return value->len + len * 3;
}